

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_JPEG_Image.cxx
# Opt level: O0

void skip_input_data(j_decompress_ptr cinfo,long num_bytes)

{
  jpeg_source_mgr *pjVar1;
  my_src_ptr src;
  long num_bytes_local;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->src;
  src = (my_src_ptr)num_bytes;
  if (0 < num_bytes) {
    while ((long)pjVar1->bytes_in_buffer < (long)src) {
      src = (my_src_ptr)((long)src - pjVar1->bytes_in_buffer);
      fill_input_buffer(cinfo);
    }
    pjVar1->next_input_byte = pjVar1->next_input_byte + (long)&(src->pub).next_input_byte;
    pjVar1->bytes_in_buffer = pjVar1->bytes_in_buffer - (long)src;
  }
  return;
}

Assistant:

static void skip_input_data(j_decompress_ptr cinfo, long num_bytes) {
    my_src_ptr src = (my_src_ptr)cinfo->src;
    if (num_bytes > 0) {
      while (num_bytes > (long)src->pub.bytes_in_buffer) {
        num_bytes -= (long)src->pub.bytes_in_buffer;
        fill_input_buffer(cinfo);
      }
      src->pub.next_input_byte += (size_t) num_bytes;
      src->pub.bytes_in_buffer -= (size_t) num_bytes;
    }
  }